

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

ExprP<tcu::Matrix<float,_4,_3>_> __thiscall
vkt::shaderexecutor::VariableP::operator_cast_to_ExprP(VariableP *this)

{
  SharedPtrStateBase *extraout_RDX;
  ExprP<tcu::Matrix<float,_4,_3>_> EVar1;
  SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_4,_3>_>_> local_28;
  VariableP<tcu::Matrix<float,_4,_3>_> *this_local;
  
  this_local = (VariableP<tcu::Matrix<float,_4,_3>_> *)this;
  de::SharedPtr::operator_cast_to_SharedPtr((SharedPtr *)&local_28);
  exprP<tcu::Matrix<float,4,3>>((shaderexecutor *)this,&local_28);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_4,_3>_>_>::~SharedPtr(&local_28);
  EVar1.super_ContainerExprPBase<tcu::Matrix<float,_4,_3>_>.
  super_ExprPBase<tcu::Matrix<float,_4,_3>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_4,_3>_>_>.m_state =
       extraout_RDX;
  EVar1.super_ContainerExprPBase<tcu::Matrix<float,_4,_3>_>.
  super_ExprPBase<tcu::Matrix<float,_4,_3>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_4,_3>_>_>.m_ptr =
       (Expr<tcu::Matrix<float,_4,_3>_> *)this;
  return (ExprP<tcu::Matrix<float,_4,_3>_>)
         EVar1.super_ContainerExprPBase<tcu::Matrix<float,_4,_3>_>.
         super_ExprPBase<tcu::Matrix<float,_4,_3>_>.
         super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_4,_3>_>_>;
}

Assistant:

operator	ExprP<T>	(void) const { return exprP(SharedPtr<const Expr<T> >(*this)); }